

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::TryCastToTimestampMS::Operation<duckdb::string_t,duckdb::timestamp_t>
               (string_t input,timestamp_t *result,bool strict)

{
  TimestampCastResult TVar1;
  char *str;
  timestamp_t input_00;
  undefined8 local_20;
  char *local_18;
  
  local_18 = input.value._8_8_;
  local_20 = input.value._0_8_;
  str = (char *)((long)&local_20 + 4);
  if (0xc < input.value._0_4_) {
    str = local_18;
  }
  TVar1 = Timestamp::TryConvertTimestamp
                    (str,(ulong)input.value._0_4_,result,(optional_ptr<int,_true>)0x0,false);
  if (TVar1 == SUCCESS) {
    input_00 = (timestamp_t)result->value;
    if ((input_00.value != -0x7fffffffffffffff) && (input_00.value != 0x7fffffffffffffff)) {
      input_00.value = Timestamp::GetEpochRounded(input_00,1000);
    }
    result->value = (int64_t)input_00;
  }
  return TVar1 == SUCCESS;
}

Assistant:

bool TryCastToTimestampMS::Operation(string_t input, timestamp_t &result, bool strict) {
	if (!TryCast::Operation<string_t, timestamp_t>(input, result, strict)) {
		return false;
	}
	result = CastTimestampUsToMs::Operation<timestamp_t, timestamp_t>(result);
	return true;
}